

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

void __thiscall Assimp::Importer::GetMemoryRequirements(Importer *this,aiMemoryInfo *in)

{
  aiScene *paVar1;
  aiMesh *paVar2;
  aiTexture *paVar3;
  aiAnimation *paVar4;
  aiNodeAnim *paVar5;
  aiMaterial *paVar6;
  uint uVar7;
  ulong uVar8;
  uint a;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x453,"void Assimp::Importer::GetMemoryRequirements(aiMemoryInfo &) const");
  }
  in->animations = 0;
  in->cameras = 0;
  in->lights = 0;
  in->total = 0;
  in->textures = 0;
  in->materials = 0;
  in->meshes = 0;
  in->nodes = 0;
  paVar1 = this->pimpl->mScene;
  if (paVar1 != (aiScene *)0x0) {
    in->total = 0x80;
    if (paVar1->mNumMeshes != 0) {
      uVar8 = 0;
      do {
        uVar9 = in->meshes + 0x520;
        in->meshes = uVar9;
        uVar7 = paVar1->mMeshes[uVar8]->mNumVertices;
        if (uVar7 != 0 && paVar1->mMeshes[uVar8]->mVertices != (aiVector3D *)0x0) {
          in->meshes = uVar9 + uVar7 * 0xc;
        }
        uVar7 = paVar1->mMeshes[uVar8]->mNumVertices;
        if (uVar7 != 0 && paVar1->mMeshes[uVar8]->mNormals != (aiVector3D *)0x0) {
          in->meshes = in->meshes + uVar7 * 0xc;
        }
        paVar2 = paVar1->mMeshes[uVar8];
        if (((paVar2->mTangents != (aiVector3D *)0x0) && (paVar2->mBitangents != (aiVector3D *)0x0))
           && (paVar2->mNumVertices != 0)) {
          in->meshes = in->meshes + paVar2->mNumVertices * 0x18;
        }
        lVar10 = 0;
        do {
          paVar2 = paVar1->mMeshes[uVar8];
          if ((paVar2->mColors[lVar10] == (aiColor4D *)0x0) || (paVar2->mNumVertices == 0)) break;
          in->meshes = in->meshes + paVar2->mNumVertices * 0x10;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        lVar10 = 0;
        do {
          paVar2 = paVar1->mMeshes[uVar8];
          if ((paVar2->mTextureCoords[lVar10] == (aiVector3D *)0x0) || (paVar2->mNumVertices == 0))
          break;
          in->meshes = in->meshes + paVar2->mNumVertices * 0xc;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        uVar7 = paVar1->mMeshes[uVar8]->mNumBones;
        if ((uVar7 != 0 && paVar1->mMeshes[uVar8]->mBones != (aiBone **)0x0) &&
           (in->meshes = in->meshes + uVar7 * 8, paVar1->mMeshes[uVar8]->mNumBones != 0)) {
          uVar11 = 0;
          do {
            uVar7 = in->meshes;
            in->meshes = uVar7 + 0x460;
            in->meshes = uVar7 + paVar1->mMeshes[uVar8]->mBones[uVar11]->mNumWeights * 8 + 0x460;
            uVar11 = uVar11 + 1;
          } while (uVar11 < paVar1->mMeshes[uVar8]->mNumBones);
        }
        in->meshes = in->meshes + paVar1->mMeshes[uVar8]->mNumFaces * 0x1c;
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumMeshes);
    }
    uVar7 = in->meshes + 0x80;
    in->total = uVar7;
    if (paVar1->mNumTextures != 0) {
      uVar8 = 0;
      do {
        paVar3 = paVar1->mTextures[uVar8];
        uVar9 = in->textures + 0x428;
        in->textures = uVar9;
        if (paVar3->mHeight == 0) {
          uVar12 = paVar3->mWidth;
        }
        else {
          uVar12 = paVar3->mHeight * paVar3->mWidth * 4;
        }
        in->textures = uVar12 + uVar9;
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumTextures);
    }
    uVar7 = uVar7 + in->textures;
    in->total = uVar7;
    if (paVar1->mNumAnimations != 0) {
      uVar8 = 0;
      do {
        paVar4 = paVar1->mAnimations[uVar8];
        in->animations = in->animations + 0x448;
        if (paVar4->mNumChannels != 0) {
          uVar9 = 0;
          do {
            paVar5 = paVar4->mChannels[uVar8];
            uVar12 = in->animations;
            in->animations = uVar12 + 0x438;
            uVar12 = uVar12 + 0x438 + paVar5->mNumPositionKeys * 0x18;
            in->animations = uVar12;
            uVar12 = uVar12 + paVar5->mNumScalingKeys * 0x18;
            in->animations = uVar12;
            in->animations = uVar12 + paVar5->mNumRotationKeys * 0x18;
            uVar9 = uVar9 + 1;
          } while (uVar9 < paVar4->mNumChannels);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumAnimations);
    }
    uVar7 = uVar7 + in->animations;
    in->total = uVar7;
    uVar9 = paVar1->mNumCameras * 0x438;
    in->cameras = uVar9;
    uVar7 = uVar7 + uVar9;
    in->total = uVar7;
    uVar9 = paVar1->mNumLights * 0x46c;
    in->lights = uVar9;
    in->total = uVar7 + uVar9;
    AddNodeWeight(&in->nodes,paVar1->mRootNode);
    uVar7 = in->total + in->nodes;
    in->total = uVar7;
    if (paVar1->mNumMaterials != 0) {
      uVar8 = 0;
      do {
        paVar6 = paVar1->mMaterials[uVar8];
        uVar9 = in->materials;
        in->materials = uVar9 + 0x10;
        in->materials = uVar9 + paVar6->mNumAllocated * 8 + 0x10;
        if (paVar6->mNumProperties != 0) {
          uVar11 = 0;
          do {
            in->materials = in->materials + paVar6->mProperties[uVar11]->mDataLength;
            uVar11 = uVar11 + 1;
          } while (uVar11 < paVar6->mNumProperties);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumMaterials);
    }
    in->total = uVar7 + in->materials;
  }
  return;
}

Assistant:

void Importer::GetMemoryRequirements(aiMemoryInfo& in) const {
    ai_assert(nullptr != pimpl);
    
    in = aiMemoryInfo();
    aiScene* mScene = pimpl->mScene;

    // return if we have no scene loaded
    if (!pimpl->mScene)
        return;


    in.total = sizeof(aiScene);

    // add all meshes
    for (unsigned int i = 0; i < mScene->mNumMeshes;++i) {
        in.meshes += sizeof(aiMesh);
        if (mScene->mMeshes[i]->HasPositions()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasNormals()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasTangentsAndBitangents()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices * 2;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a) {
            if (mScene->mMeshes[i]->HasVertexColors(a)) {
                in.meshes += sizeof(aiColor4D) * mScene->mMeshes[i]->mNumVertices;
            } else {
                break;
            }
        }
        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a) {
            if (mScene->mMeshes[i]->HasTextureCoords(a)) {
                in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
            } else {
                break;
            }
        }
        if (mScene->mMeshes[i]->HasBones()) {
            in.meshes += sizeof(void*) * mScene->mMeshes[i]->mNumBones;
            for (unsigned int p = 0; p < mScene->mMeshes[i]->mNumBones;++p) {
                in.meshes += sizeof(aiBone);
                in.meshes += mScene->mMeshes[i]->mBones[p]->mNumWeights * sizeof(aiVertexWeight);
            }
        }
        in.meshes += (sizeof(aiFace) + 3 * sizeof(unsigned int))*mScene->mMeshes[i]->mNumFaces;
    }
    in.total += in.meshes;

    // add all embedded textures
    for (unsigned int i = 0; i < mScene->mNumTextures;++i) {
        const aiTexture* pc = mScene->mTextures[i];
        in.textures += sizeof(aiTexture);
        if (pc->mHeight) {
            in.textures += 4 * pc->mHeight * pc->mWidth;
        } else {
            in.textures += pc->mWidth;
        }
    }
    in.total += in.textures;

    // add all animations
    for (unsigned int i = 0; i < mScene->mNumAnimations;++i) {
        const aiAnimation* pc = mScene->mAnimations[i];
        in.animations += sizeof(aiAnimation);

        // add all bone anims
        for (unsigned int a = 0; a < pc->mNumChannels; ++a) {
            const aiNodeAnim* pc2 = pc->mChannels[i];
            in.animations += sizeof(aiNodeAnim);
            in.animations += pc2->mNumPositionKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumScalingKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumRotationKeys * sizeof(aiQuatKey);
        }
    }
    in.total += in.animations;

    // add all cameras and all lights
    in.total += in.cameras = sizeof(aiCamera) *  mScene->mNumCameras;
    in.total += in.lights  = sizeof(aiLight)  *  mScene->mNumLights;

    // add all nodes
    AddNodeWeight(in.nodes,mScene->mRootNode);
    in.total += in.nodes;

    // add all materials
    for (unsigned int i = 0; i < mScene->mNumMaterials;++i) {
        const aiMaterial* pc = mScene->mMaterials[i];
        in.materials += sizeof(aiMaterial);
        in.materials += pc->mNumAllocated * sizeof(void*);

        for (unsigned int a = 0; a < pc->mNumProperties;++a) {
            in.materials += pc->mProperties[a]->mDataLength;
        }
    }
    in.total += in.materials;
}